

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_graph.c
# Opt level: O2

void canvas_rminlet(_glist *x,_inlet *ip)

{
  _glist *x_00;
  int iVar1;
  
  if (((x->field_0xe9 & 8) == 0) && (x_00 = x->gl_owner, x_00 != (_glist *)0x0)) {
    iVar1 = glist_isvisible(x_00);
    if ((iVar1 == 0) || ((x_00->field_0xe8 & 0x40) != 0)) {
      canvas_deletelinesforio(x_00,&x->gl_obj,ip,(_outlet *)0x0);
    }
    else {
      iVar1 = glist_istoplevel(x_00);
      canvas_deletelinesforio(x_00,&x->gl_obj,ip,(_outlet *)0x0);
      if (iVar1 != 0) {
        gobj_vis((t_gobj *)x,x->gl_owner,0);
        inlet_free(ip);
        gobj_vis((t_gobj *)x,x->gl_owner,1);
        canvas_fixlinesfor(x->gl_owner,&x->gl_obj);
        return;
      }
    }
  }
  inlet_free(ip);
  return;
}

Assistant:

void canvas_rminlet(t_canvas *x, t_inlet *ip)
{
    t_canvas *owner = x->gl_isclone ? NULL : x->gl_owner;
    int redraw = (owner && glist_isvisible(owner) && (!owner->gl_isdeleting)
        && glist_istoplevel(owner));

    if (owner) canvas_deletelinesforio(owner, &x->gl_obj, ip, 0);
    if (redraw)
        gobj_vis(&x->gl_gobj, x->gl_owner, 0);
    inlet_free(ip);
    if (redraw)
    {
        gobj_vis(&x->gl_gobj, x->gl_owner, 1);
        canvas_fixlinesfor(x->gl_owner, &x->gl_obj);
    }
}